

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_duplicatesImportedOnceOnly_Test::~Importer_duplicatesImportedOnceOnly_Test
          (Importer_duplicatesImportedOnceOnly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, duplicatesImportedOnceOnly)
{
    std::string in =
        "<?xml version=\"1.0\" encoding=\"iso-8859-1\"?>\n"
        "<model name=\"forked_import\" xmlns=\"http://www.cellml.org/cellml/2.0#\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" xmlns:xlink=\"http://www.w3.org/1999/xlink\">\n"
        "  <import xlink:href=\"prong.cellml\">\n"
        "    <component name=\"left\" component_ref=\"component1\" />\n"
        "  </import>\n"
        "  <import xlink:href=\"prong.cellml\">\n"
        "    <component name=\"right\" component_ref=\"component1\" />\n"
        "  </import>\n"
        "  <import xlink:href=\"prong.cellml\">\n"
        "    <component name=\"centre\" component_ref=\"component1\" />\n"
        "  </import>\n"
        "</model>";
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(in);
    auto importer = libcellml::Importer::create();

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(3), model->componentCount()); // Three imported components ...
    EXPECT_EQ(size_t(1), importer->libraryCount()); // ... but just one imported model.
    EXPECT_FALSE(model->hasUnresolvedImports());
}